

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void renameParseCleanup(Parse *pParse)

{
  sqlite3 *db;
  RenameToken *pRVar1;
  RenameToken *p;
  
  db = pParse->db;
  if (pParse->pVdbe != (Vdbe *)0x0) {
    sqlite3VdbeFinalize(pParse->pVdbe);
  }
  sqlite3DeleteTable(db,pParse->pNewTable);
  if (pParse->pNewIndex != (Index *)0x0) {
    sqlite3FreeIndex(db,pParse->pNewIndex);
  }
  sqlite3DeleteTrigger(db,pParse->pNewTrigger);
  if (pParse->zErrMsg != (char *)0x0) {
    sqlite3DbFreeNN(db,pParse->zErrMsg);
  }
  p = pParse->pRename;
  while (p != (RenameToken *)0x0) {
    pRVar1 = p->pNext;
    sqlite3DbFreeNN(db,p);
    p = pRVar1;
  }
  sqlite3ParserReset(pParse);
  return;
}

Assistant:

static void renameParseCleanup(Parse *pParse){
  sqlite3 *db = pParse->db;
  if( pParse->pVdbe ){
    sqlite3VdbeFinalize(pParse->pVdbe);
  }
  sqlite3DeleteTable(db, pParse->pNewTable);
  if( pParse->pNewIndex ) sqlite3FreeIndex(db, pParse->pNewIndex);
  sqlite3DeleteTrigger(db, pParse->pNewTrigger);
  sqlite3DbFree(db, pParse->zErrMsg);
  renameTokenFree(db, pParse->pRename);
  sqlite3ParserReset(pParse);
}